

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

StringBuilder * __thiscall Potassco::StringBuilder::resize(StringBuilder *this,size_t n,char c)

{
  string *psVar1;
  byte bVar2;
  Buffer b;
  
  buffer(&b,this);
  if (n < b.used || n - b.used == 0) {
    if (n < b.used) {
      bVar2 = (this->field_0).sbo_[0x3f] & 0xc0;
      if (bVar2 == 0x80) {
        psVar1 = (this->field_0).str_;
        (this->field_0).buf_.used = n;
        *(undefined1 *)((long)&(psVar1->_M_dataplus)._M_p + n) = 0;
      }
      else if (bVar2 == 0x40) {
        std::__cxx11::string::resize((ulong)(this->field_0).str_);
      }
      else {
        (this->field_0).sbo_[n] = '\0';
        (this->field_0).sbo_[0x3f] = '?' - (char)n;
      }
    }
  }
  else {
    append(this,n - b.used,c);
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::resize(std::size_t n, char c) {
	Buffer b = buffer();
	if (n > b.used) {
		POTASSCO_REQUIRE(n <= b.size || tag() != Buf, "StringBuilder: buffer too small");
		append(n - b.used, c);
	}
	else if (n < b.used) {
		if      (type() == Str) { str_->resize(n); }
		else if (type() == Buf) { buf_.head[buf_.used = n] = 0; }
		else                    { sbo_[n] = 0; setTag(static_cast<uint8_t>(SboCap - n)); }
	}
	return *this;
}